

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

int __thiscall CVmDynFuncVMIfc::validate_pool_str(CVmDynFuncVMIfc *this,uint32_t ofs)

{
  int iVar1;
  pool_ofs_t in_ESI;
  CVmPoolInMem *in_RDI;
  CVmPoolInMem *unaff_retaddr;
  size_t len;
  pool_ofs_t in_stack_fffffffffffffffc;
  
  iVar1 = CVmPoolInMem::validate_ofs(unaff_retaddr,in_stack_fffffffffffffffc);
  if ((iVar1 != 0) &&
     (iVar1 = CVmPoolInMem::validate_ofs(unaff_retaddr,in_stack_fffffffffffffffc), iVar1 != 0)) {
    CVmPoolInMem::get_ptr(in_RDI,in_ESI);
    vmb_get_len((char *)0x33079c);
    iVar1 = CVmPoolInMem::validate_ofs(unaff_retaddr,in_stack_fffffffffffffffc);
    if (iVar1 == 0) {
      return 0;
    }
    return 1;
  }
  return 0;
}

Assistant:

virtual int validate_pool_str(uint32_t ofs)
    {
        /* establish globals */
        VMGLOB_PTR(vmg);

        /* validate the starting offset and full length prefix */
        if (!G_const_pool->validate_ofs(ofs)
            || !G_const_pool->validate_ofs(ofs+1))
            return FALSE;

        /* get the length */
        size_t len = vmb_get_len(G_const_pool->get_ptr(ofs));

        /* make sure the end of the string is valid as well */
        if (!G_const_pool->validate_ofs(ofs + VMB_LEN + len - 1))
            return FALSE;

        /* success */
        return TRUE;
    }